

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mini-mpq.c
# Opt level: O1

int mpq_cmp(__mpq_struct *a,__mpq_struct *b)

{
  int iVar1;
  mpz_t t2;
  mpz_t t1;
  __mpz_struct local_48;
  __mpz_struct local_38;
  
  local_38._mp_alloc = 0;
  local_38._mp_size = 0;
  local_38._mp_d = &mpz_init::dummy_limb;
  local_48._mp_alloc = 0;
  local_48._mp_size = 0;
  local_48._mp_d = &mpz_init::dummy_limb;
  mpz_mul(&local_38,&a->_mp_num,&b->_mp_den);
  mpz_mul(&local_48,&b->_mp_num,&a->_mp_den);
  iVar1 = mpz_cmp(&local_38,&local_48);
  if ((long)local_38._mp_alloc != 0) {
    (*gmp_free_func)(local_38._mp_d,(long)local_38._mp_alloc << 3);
  }
  if ((long)local_48._mp_alloc != 0) {
    (*gmp_free_func)(local_48._mp_d,(long)local_48._mp_alloc << 3);
  }
  return iVar1;
}

Assistant:

int
mpq_cmp (const mpq_t a, const mpq_t b)
{
  mpz_t t1, t2;
  int res;

  mpz_init (t1);
  mpz_init (t2);
  mpz_mul (t1, mpq_numref (a), mpq_denref (b));
  mpz_mul (t2, mpq_numref (b), mpq_denref (a));
  res = mpz_cmp (t1, t2);
  mpz_clear (t1);
  mpz_clear (t2);

  return res;
}